

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_def.c
# Opt level: O0

upb_FieldDef * upb_MessageDef_FindByJsonNameWithSize(upb_MessageDef *m,char *name,size_t size)

{
  _Bool _Var1;
  upb_value local_30;
  upb_value val;
  size_t size_local;
  char *name_local;
  upb_MessageDef *m_local;
  
  val.val = size;
  _Var1 = upb_strtable_lookup2(&m->jtof,name,size,&local_30);
  if (_Var1) {
    m_local = (upb_MessageDef *)upb_value_getconstptr(local_30);
  }
  else {
    _Var1 = upb_strtable_lookup2(&m->ntof,name,val.val,&local_30);
    if (_Var1) {
      m_local = (upb_MessageDef *)_upb_DefType_Unpack(local_30,UPB_DEFTYPE_EXT);
    }
    else {
      m_local = (upb_MessageDef *)0x0;
    }
  }
  return (upb_FieldDef *)m_local;
}

Assistant:

const upb_FieldDef* upb_MessageDef_FindByJsonNameWithSize(
    const upb_MessageDef* m, const char* name, size_t size) {
  upb_value val;

  if (upb_strtable_lookup2(&m->jtof, name, size, &val)) {
    return upb_value_getconstptr(val);
  }

  if (!upb_strtable_lookup2(&m->ntof, name, size, &val)) {
    return NULL;
  }

  return _upb_DefType_Unpack(val, UPB_DEFTYPE_FIELD);
}